

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

UniValue * __thiscall
rpc_tests::ValueFromString(UniValue *__return_storage_ptr__,rpc_tests *this,string *str)

{
  UniValue *pUVar1;
  string str_00;
  long in_FS_OFFSET;
  undefined1 *puVar2;
  undefined8 in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  pUVar1 = *(UniValue **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val)._M_string_length = 0;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->typ = VNULL;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = &stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffc8,this,this + (long)&str->_M_dataplus);
  str_00._M_string_length = in_stack_ffffffffffffffd0;
  str_00._M_dataplus._M_p = puVar2;
  str_00.field_2._M_allocated_capacity = in_stack_ffffffffffffffd8;
  str_00.field_2._8_8_ = in_stack_ffffffffffffffe0;
  ::UniValue::setNumStr(__return_storage_ptr__,str_00);
  if (puVar2 != &stack0xffffffffffffffd8) {
    operator_delete(puVar2,in_stack_ffffffffffffffd8 + 1);
  }
  if (*(UniValue **)(in_FS_OFFSET + 0x28) == pUVar1) {
    return *(UniValue **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static UniValue ValueFromString(const std::string& str) noexcept
{
    UniValue value;
    value.setNumStr(str);
    return value;
}